

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void printCCOperand(MCInst *MI,int opNum,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  int64_t iVar2;
  char *s;
  sparc_cc local_2c;
  sparc_cc local_24;
  int CC;
  SStream *O_local;
  int opNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,opNum);
  iVar2 = MCOperand_getImm(op);
  local_2c = (int)iVar2 + SPARC_CC_ICC_N;
  uVar1 = MCInst_getOpcode(MI);
  if ((((uVar1 - 0x4d < 4) || (uVar1 - 0x95 < 2)) || (uVar1 == 0xb8)) ||
     (((uVar1 == 0xbc || (uVar1 == 0xd2)) ||
      ((uVar1 - 0x146 < 2 || (local_24 = local_2c, uVar1 - 0x1d8 < 5)))))) {
    if ((int)local_2c < 0x110) {
      local_2c = (int)iVar2 + SPARC_CC_FCC_N;
    }
    local_24 = local_2c;
  }
  s = SPARCCondCodeToString(local_24);
  SStream_concat0(O,s);
  if (MI->csh->detail != CS_OPT_OFF) {
    (MI->flat_insn->detail->field_6).sparc.cc = local_24;
  }
  return;
}

Assistant:

static void printCCOperand(MCInst *MI, int opNum, SStream *O)
{
	int CC = (int)MCOperand_getImm(MCInst_getOperand(MI, opNum)) + 256;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case SP_FBCOND:
		case SP_FBCONDA:
		case SP_BPFCC:
		case SP_BPFCCA:
		case SP_BPFCCNT:
		case SP_BPFCCANT:
		case SP_MOVFCCrr:  case SP_V9MOVFCCrr:
		case SP_MOVFCCri:  case SP_V9MOVFCCri:
		case SP_FMOVS_FCC: case SP_V9FMOVS_FCC:
		case SP_FMOVD_FCC: case SP_V9FMOVD_FCC:
		case SP_FMOVQ_FCC: case SP_V9FMOVQ_FCC:
				 // Make sure CC is a fp conditional flag.
				 CC = (CC < 16+256) ? (CC + 16) : CC;
				 break;
	}

	SStream_concat0(O, SPARCCondCodeToString((sparc_cc)CC));

	if (MI->csh->detail)
		MI->flat_insn->detail->sparc.cc = (sparc_cc)CC;
}